

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

void CVmObjGramProd::enum_props_cb(void *ctx0,vm_prop_id_t prop,vm_val_t *param_3)

{
  void *pvVar1;
  short in_SI;
  long *in_RDI;
  size_t i;
  vmgram_match_info *ep;
  enum_props_ctx *ctx;
  ulong local_30;
  short *local_28;
  
  local_30 = 0;
  local_28 = *(short **)(*in_RDI + 0x20);
  while( true ) {
    if ((ulong)in_RDI[1] <= local_30) {
      if (in_RDI[1] == *(long *)(*in_RDI + 0x28)) {
        *(long *)(*in_RDI + 0x28) = *(long *)(*in_RDI + 0x28) + 0x40;
        pvVar1 = realloc(*(void **)(*in_RDI + 0x20),*(long *)(*in_RDI + 0x28) << 1);
        *(void **)(*in_RDI + 0x20) = pvVar1;
      }
      *(short *)(*(long *)(*in_RDI + 0x20) + in_RDI[1] * 2) = in_SI;
      in_RDI[1] = in_RDI[1] + 1;
      return;
    }
    if (*local_28 == in_SI) break;
    local_30 = local_30 + 1;
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void CVmObjGramProd::enum_props_cb(VMG_ void *ctx0, vm_prop_id_t prop,
                                   const vm_val_t * /*match_val*/)
{
    enum_props_ctx *ctx = (enum_props_ctx *)ctx0;
    vmgram_match_info *ep;
    size_t i;

    /* if this property is already in our list, don't add it again */
    for (i = 0, ep = ctx->ext->prop_enum_arr_ ; i < ctx->cnt ; ++i, ++ep)
    {
        /* if we already have this one, we can ignore it */
        if (ep->prop == prop)
            return;
    }
    
    /* we need to add it - if the array is full, expand it */
    if (ctx->cnt == ctx->ext->prop_enum_max_)
    {
        /* reallocate the array with more space */
        ctx->ext->prop_enum_max_ += 64;
        ctx->ext->prop_enum_arr_ = (vmgram_match_info *)
                                   t3realloc(ctx->ext->prop_enum_arr_,
                                             ctx->ext->prop_enum_max_
                                             * sizeof(vmgram_match_info));
    }

    /* add the property to the array */
    ep = &ctx->ext->prop_enum_arr_[ctx->cnt];
    ep->prop = prop;

    /* count the new entry */
    ctx->cnt++;
}